

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5MultiIterFree(Fts5Iter *pIter)

{
  int iVar1;
  Fts5TombstoneArray *p;
  int ii;
  long lVar2;
  long lVar3;
  Fts5SegIter *pFVar4;
  
  if (pIter != (Fts5Iter *)0x0) {
    for (lVar3 = 0; lVar3 < pIter->nSeg; lVar3 = lVar3 + 1) {
      sqlite3Fts5BufferFree(&pIter->aSeg[lVar3].term);
      sqlite3_free(pIter->aSeg[lVar3].pLeaf);
      sqlite3_free(pIter->aSeg[lVar3].pNextLeaf);
      p = pIter->aSeg[lVar3].pTombArray;
      if ((p != (Fts5TombstoneArray *)0x0) && (iVar1 = p->nRef, p->nRef = iVar1 + -1, iVar1 < 2)) {
        for (lVar2 = 0; lVar2 < p->nTombstone; lVar2 = lVar2 + 1) {
          sqlite3_free(p->apTombstone[lVar2]);
        }
        sqlite3_free(p);
      }
      pFVar4 = pIter->aSeg + lVar3;
      fts5DlidxIterFree(pFVar4->pDlidx);
      sqlite3_free(pFVar4->aRowidOffset);
      pFVar4->iRowid = 0;
      pFVar4->nPos = 0;
      pFVar4->bDel = '\0';
      *(undefined3 *)&pFVar4->field_0x7d = 0;
      (pFVar4->term).p = (u8 *)0x0;
      (pFVar4->term).n = 0;
      (pFVar4->term).nSpace = 0;
      pFVar4->aRowidOffset = (int *)0x0;
      pFVar4->pDlidx = (Fts5DlidxIter *)0x0;
      pFVar4->iPgidxOff = 0;
      pFVar4->iEndofDoclist = 0;
      pFVar4->iRowidOffset = 0;
      pFVar4->nRowidOffset = 0;
      pFVar4->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
      pFVar4->iTermLeafPgno = 0;
      pFVar4->iTermLeafOffset = 0;
      pFVar4->iLeafOffset = 0;
      pFVar4->pTombArray = (Fts5TombstoneArray *)0x0;
      pFVar4->pLeaf = (Fts5Data *)0x0;
      pFVar4->pNextLeaf = (Fts5Data *)0x0;
      pFVar4->pSeg = (Fts5StructureSegment *)0x0;
      pFVar4->flags = 0;
      pFVar4->iLeafPgno = 0;
    }
    sqlite3Fts5BufferFree(&pIter->poslist);
    sqlite3_free(pIter);
    return;
  }
  return;
}

Assistant:

static void fts5MultiIterFree(Fts5Iter *pIter){
  if( pIter ){
    int i;
    for(i=0; i<pIter->nSeg; i++){
      fts5SegIterClear(&pIter->aSeg[i]);
    }
    fts5BufferFree(&pIter->poslist);
    sqlite3_free(pIter);
  }
}